

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkPrintNodes(Wlc_Ntk_t *p,int Type)

{
  int iVar1;
  uint uVar2;
  Wlc_Obj_t *p_00;
  Wlc_Obj_t *pWVar3;
  char *pcVar4;
  uint local_24;
  int Counter;
  int i;
  Wlc_Obj_t *pObj;
  int Type_local;
  Wlc_Ntk_t *p_local;
  
  printf("Operation %s\n",Wlc_Names[Type]);
  for (local_24 = 1; iVar1 = Wlc_NtkObjNumMax(p), (int)local_24 < iVar1; local_24 = local_24 + 1) {
    p_00 = Wlc_NtkObj(p,local_24);
    if ((uint)(*(ushort *)p_00 & 0x3f) == Type) {
      printf("%8d  :");
      printf("%8d  :  ",(ulong)local_24);
      uVar2 = Wlc_ObjRange(p_00);
      iVar1 = Wlc_ObjIsSigned(p_00);
      pcVar4 = " ";
      if (iVar1 != 0) {
        pcVar4 = "s";
      }
      printf("%3d%s = ",(ulong)uVar2,pcVar4);
      pWVar3 = Wlc_ObjFanin0(p,p_00);
      uVar2 = Wlc_ObjRange(pWVar3);
      pWVar3 = Wlc_ObjFanin0(p,p_00);
      iVar1 = Wlc_ObjIsSigned(pWVar3);
      pcVar4 = " ";
      if (iVar1 != 0) {
        pcVar4 = "s";
      }
      printf("%3d%s  %s ",(ulong)uVar2,pcVar4,Wlc_Names[Type]);
      pWVar3 = Wlc_ObjFanin1(p,p_00);
      uVar2 = Wlc_ObjRange(pWVar3);
      pWVar3 = Wlc_ObjFanin1(p,p_00);
      iVar1 = Wlc_ObjIsSigned(pWVar3);
      pcVar4 = " ";
      if (iVar1 != 0) {
        pcVar4 = "s";
      }
      printf("%3d%s ",(ulong)uVar2,pcVar4);
      printf(" :    ");
      pcVar4 = Wlc_ObjName(p,local_24);
      printf("%-12s =  ",pcVar4);
      iVar1 = Wlc_ObjFaninId0(p_00);
      pcVar4 = Wlc_ObjName(p,iVar1);
      printf("%-12s  %s  ",pcVar4,Wlc_Names[Type]);
      iVar1 = Wlc_ObjFaninId1(p_00);
      pcVar4 = Wlc_ObjName(p,iVar1);
      printf("%-12s ",pcVar4);
      printf("\n");
    }
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodes( Wlc_Ntk_t * p, int Type )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    printf( "Operation %s\n", Wlc_Names[Type] );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( (int)pObj->Type != Type )
            continue;
        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Wlc_ObjRange(pObj),                   Wlc_ObjIsSigned(pObj) ? "s" : " " );
        printf( "%3d%s  %s ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[Type] );
        printf( "%3d%s ",      Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Wlc_ObjName(p, i) );
        printf( "%-12s  %s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[Type] );
        printf( "%-12s ",      Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        printf( "\n" );
    }
}